

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O3

Node * prvTidyParseText(TidyDocImpl *doc,Node *field,GetTokenMode mode)

{
  Node *pNVar1;
  bool bVar2;
  Bool BVar3;
  Node *node;
  Node **ppNVar4;
  GetTokenMode mode_00;
  
  doc->lexer->insert = (IStack *)0x0;
  if (((field == (Node *)0x0) || (field->tag == (Dict *)0x0)) ||
     (field->tag->id != TidyTag_TEXTAREA)) {
    mode_00 = MixedContent;
    bVar2 = false;
  }
  else {
    mode_00 = Preformatted;
    bVar2 = true;
  }
  node = prvTidyGetToken(doc,mode_00);
  if (node != (Node *)0x0) {
    do {
      if ((node->tag == field->tag) && (node->type == EndTag)) {
        prvTidyFreeNode(doc,node);
        field->closed = yes;
LAB_0013db12:
        TrimSpaces(doc,field);
        return (Node *)0x0;
      }
      BVar3 = InsertMisc(field,node);
      if (BVar3 == no) {
        BVar3 = prvTidynodeIsText(node);
        if (BVar3 == no) {
          if ((node->tag == (Dict *)0x0) || ((node->tag->model & 0x410) != 0x10)) {
            if ((field->tag->model & 0x8000) == 0) {
              prvTidyReport(doc,field,node,0x259);
            }
            prvTidyUngetToken(doc);
            goto LAB_0013db12;
          }
          prvTidyReport(doc,field,node,0x235);
        }
        else {
          if (field->content == (Node *)0x0 && !bVar2) {
            TrimSpaces(doc,field);
          }
          if (node->start < node->end) {
            node->parent = field;
            pNVar1 = field->last;
            node->prev = pNVar1;
            ppNVar4 = &pNVar1->next;
            if (pNVar1 == (Node *)0x0) {
              ppNVar4 = &field->content;
            }
            *ppNVar4 = node;
            field->last = node;
            goto LAB_0013daa1;
          }
        }
        prvTidyFreeNode(doc,node);
      }
LAB_0013daa1:
      node = prvTidyGetToken(doc,mode_00);
    } while (node != (Node *)0x0);
  }
  if ((field->tag->model & 0x8000) == 0) {
    prvTidyReport(doc,field,(Node *)0x0,0x25a);
  }
  return (Node *)0x0;
}

Assistant:

Node* TY_(ParseText)( TidyDocImpl* doc, Node *field, GetTokenMode mode )
{
    Lexer* lexer = doc->lexer;
    Node *node;
    DEBUG_LOG_COUNTERS;
    
    DEBUG_LOG_ENTER_WITH_NODE(field);

    lexer->insert = NULL;  /* defer implicit inline start tags */

    DEBUG_LOG_GET_OLD_MODE;
    if ( nodeIsTEXTAREA(field) )
        mode = Preformatted;
    else
        mode = MixedContent;  /* kludge for font tags */
    DEBUG_LOG_CHANGE_MODE;

    while ((node = TY_(GetToken)(doc, mode)) != NULL)
    {
        if (node->tag == field->tag && node->type == EndTag)
        {
            TY_(FreeNode)( doc, node);
            field->closed = yes;
            TrimSpaces(doc, field);
            DEBUG_LOG_EXIT;
            return NULL;
        }

        /* deal with comments etc. */
        if (InsertMisc(field, node))
            continue;

        if (TY_(nodeIsText)(node))
        {
            /* only called for 1st child */
            if (field->content == NULL && !(mode & Preformatted))
                TrimSpaces(doc, field);

            if (node->start >= node->end)
            {
                TY_(FreeNode)( doc, node);
                continue;
            }

            TY_(InsertNodeAtEnd)(field, node);
            continue;
        }

        /* for textarea should all cases of < and & be escaped? */

        /* discard inline tags e.g. font */
        if (   node->tag
            && node->tag->model & CM_INLINE
            && !(node->tag->model & CM_FIELD)) /* #487283 - fix by Lee Passey 25 Jan 02 */
        {
            TY_(Report)(doc, field, node, DISCARDING_UNEXPECTED);
            TY_(FreeNode)( doc, node);
            continue;
        }

        /* terminate element on other tags */
        if (!(field->tag->model & CM_OPT))
            TY_(Report)(doc, field, node, MISSING_ENDTAG_BEFORE);

        TY_(UngetToken)( doc );
        TrimSpaces(doc, field);
        DEBUG_LOG_EXIT;
        return NULL;
    }

    if (!(field->tag->model & CM_OPT))
        TY_(Report)(doc, field, node, MISSING_ENDTAG_FOR);
    DEBUG_LOG_EXIT;
    return NULL;
}